

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

Matrix<double,_3,_3> * __thiscall
gl4cts::Math::outerProduct<3,3>
          (Matrix<double,_3,_3> *__return_storage_ptr__,Math *this,Vector<double,_3> *left,
          Vector<double,_3> *right)

{
  double dVar1;
  double *pdVar2;
  Matrix<double,_3,_3> local_b0;
  uint local_68;
  uint local_64;
  GLuint i_1;
  GLuint i;
  undefined1 local_50 [8];
  Matrix<double,_1,_3> right_mat;
  Matrix<double,_3,_1> left_mat;
  Vector<double,_3> *right_local;
  Vector<double,_3> *left_local;
  Matrix<double,_3,_3> *result;
  
  tcu::Matrix<double,_3,_1>::Matrix((Matrix<double,_3,_1> *)(right_mat.m_data.m_data + 2));
  tcu::Matrix<double,_1,_3>::Matrix((Matrix<double,_1,_3> *)local_50);
  i_1._3_1_ = 0;
  tcu::Matrix<double,_3,_3>::Matrix(__return_storage_ptr__);
  for (local_64 = 0; local_64 < 3; local_64 = local_64 + 1) {
    pdVar2 = tcu::Vector<double,_3>::operator[]((Vector<double,_3> *)this,local_64);
    dVar1 = *pdVar2;
    pdVar2 = tcu::Matrix<double,_3,_1>::operator()
                       ((Matrix<double,_3,_1> *)(right_mat.m_data.m_data + 2),local_64,0);
    *pdVar2 = dVar1;
  }
  for (local_68 = 0; local_68 < 3; local_68 = local_68 + 1) {
    pdVar2 = tcu::Vector<double,_3>::operator[](left,local_68);
    dVar1 = *pdVar2;
    pdVar2 = tcu::Matrix<double,_1,_3>::operator()((Matrix<double,_1,_3> *)local_50,0,local_68);
    *pdVar2 = dVar1;
  }
  tcu::operator*(&local_b0,(Matrix<double,_3,_1> *)(right_mat.m_data.m_data + 2),
                 (Matrix<double,_1,_3> *)local_50);
  tcu::Matrix<double,_3,_3>::operator=(__return_storage_ptr__,&local_b0);
  tcu::Matrix<double,_3,_3>::~Matrix(&local_b0);
  i_1._3_1_ = 1;
  tcu::Matrix<double,_1,_3>::~Matrix((Matrix<double,_1,_3> *)local_50);
  tcu::Matrix<double,_3,_1>::~Matrix((Matrix<double,_3,_1> *)(right_mat.m_data.m_data + 2));
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Rows, Cols> outerProduct(const tcu::Vector<glw::GLdouble, Rows>& left,
														   const tcu::Vector<glw::GLdouble, Cols>& right)
{
	tcu::Matrix<glw::GLdouble, Rows, 1>	left_mat;
	tcu::Matrix<glw::GLdouble, 1, Cols>	right_mat;
	tcu::Matrix<glw::GLdouble, Rows, Cols> result;

	for (glw::GLuint i = 0; i < Rows; ++i)
	{
		left_mat(i, 0) = left[i];
	}

	for (glw::GLuint i = 0; i < Cols; ++i)
	{
		right_mat(0, i) = right[i];
	}

	result = left_mat * right_mat;

	return result;
}